

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O3

int __thiscall
ctemplate_htmlparser::HtmlparserCppTest::NameToId
          (HtmlparserCppTest *this,IdNameMap *list,string *name)

{
  HtmlParser *source;
  _Rb_tree_header *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  char *pcVar2;
  size_t sVar3;
  IdNameMap *pIVar4;
  bool bVar5;
  int iVar6;
  int extraout_EAX;
  HtmlparserCppTest *pHVar7;
  HtmlparserCppTest *extraout_RAX;
  undefined8 extraout_RAX_00;
  long lVar8;
  HtmlparserCppTest *pHVar9;
  HtmlparserCppTest *pHVar10;
  HtmlparserCppTest *pHVar11;
  HtmlparserCppTest *extraout_RAX_01;
  HtmlparserCppTest *pHVar12;
  HtmlparserCppTest *extraout_RAX_02;
  undefined7 extraout_var;
  undefined8 uVar13;
  undefined7 extraout_var_00;
  HtmlparserCppTest *extraout_RAX_03;
  char *extraout_RAX_04;
  HtmlparserCppTest *pHVar14;
  char *extraout_RAX_05;
  char *extraout_RAX_06;
  int *piVar15;
  HtmlParser *this_00;
  const_iterator cVar16;
  mapped_type *ppHVar17;
  undefined8 extraout_RAX_07;
  undefined7 uVar18;
  ulong uVar19;
  htmlparser_ctx *phVar20;
  undefined1 *puVar21;
  undefined1 *puVar22;
  htmlparser_ctx_s *phVar23;
  _Base_ptr p_Var24;
  _Base_ptr p_Var25;
  pointer this_01;
  _Base_ptr unaff_R12;
  HtmlparserCppTest *unaff_R14;
  pointer str_00;
  _Base_ptr unaff_R15;
  bool bVar26;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vStack_260;
  HtmlparserCppTest *pHStack_248;
  _Base_ptr p_Stack_240;
  undefined1 auStack_200 [16];
  _Base_ptr p_Stack_1f0;
  HtmlparserCppTest *pHStack_1e8;
  _Base_ptr p_Stack_1e0;
  undefined1 auStack_1d8 [16];
  _Base_ptr p_Stack_1c8;
  HtmlparserCppTest *pHStack_1c0;
  _Base_ptr p_Stack_1b8;
  char *pcStack_1b0;
  HtmlParser HStack_1a8;
  allocator aStack_169;
  HtmlparserCppTest *pHStack_168;
  size_t sStack_160;
  HtmlparserCppTest HStack_158;
  HtmlparserCppTest *pHStack_118;
  ulong uStack_110;
  HtmlparserCppTest *pHStack_100;
  allocator aStack_e9;
  HtmlparserCppTest *pHStack_e8;
  size_t sStack_e0;
  undefined1 auStack_d8 [40];
  HtmlparserCppTest *pHStack_b0;
  HtmlParser HStack_a8;
  HtmlparserCppTest HStack_a0;
  undefined8 uStack_68;
  IdNameMap *pIStack_60;
  HtmlparserCppTest *pHStack_58;
  allocator aStack_49;
  HtmlparserCppTest *pHStack_48;
  char *pcStack_40;
  
  if (list != (IdNameMap *)0x0) {
    pcVar2 = list->name;
    while (pcVar2 != (char *)0x0) {
      iVar6 = std::__cxx11::string::compare((char *)name);
      if (iVar6 == 0) goto LAB_00106f2c;
      pIVar4 = list + 1;
      list = list + 1;
      pcVar2 = pIVar4->name;
    }
    NameToId();
LAB_00106f2c:
    return list->id;
  }
  NameToId();
  pHVar12 = (HtmlparserCppTest *)(this->parser_).parser_;
  pHStack_58 = (HtmlparserCppTest *)0x106f4f;
  iVar6 = ctemplate_htmlparser::htmlparser_state((htmlparser_ctx_s *)pHVar12);
  puVar21 = kStateMap;
  pHStack_58 = (HtmlparserCppTest *)0x106f5d;
  pHVar7 = (HtmlparserCppTest *)IdToName(pHVar12,(IdNameMap *)kStateMap,iVar6);
  if (list->name == (char *)0x0) {
    pHStack_58 = (HtmlparserCppTest *)0x106fcd;
    ValidateState();
  }
  else {
    pHVar12 = (HtmlparserCppTest *)&pHStack_48;
    pHStack_58 = (HtmlparserCppTest *)0x106f79;
    std::__cxx11::string::string((string *)pHVar12,(char *)pHVar7,&aStack_49);
    pcVar2 = list->name;
    puVar21 = (undefined1 *)pHVar7;
    if (pcVar2 == pcStack_40) {
      uVar18 = (undefined7)((ulong)list >> 8);
      if (pcVar2 == (char *)0x0) {
        list = (IdNameMap *)CONCAT71(uVar18,1);
      }
      else {
        pHVar12 = *(HtmlparserCppTest **)list;
        pHStack_58 = (HtmlparserCppTest *)0x106f98;
        puVar21 = (undefined1 *)pHStack_48;
        iVar6 = bcmp(pHVar12,pHStack_48,(size_t)pcVar2);
        list = (IdNameMap *)CONCAT71(uVar18,iVar6 == 0);
      }
    }
    else {
      list = (IdNameMap *)0x0;
    }
    pHVar7 = (HtmlparserCppTest *)&stack0xffffffffffffffc8;
    if (pHStack_48 != pHVar7) {
      pHStack_58 = (HtmlparserCppTest *)0x106fbc;
      pHVar12 = pHStack_48;
      operator_delete(pHStack_48);
      pHVar7 = extraout_RAX;
    }
    unaff_R14 = pHStack_48;
    if ((char)list != '\0') {
      return (int)pHVar7;
    }
  }
  pHStack_58 = (HtmlparserCppTest *)ValidateTag;
  ValidateState();
  pHStack_58 = unaff_R14;
  pIStack_60 = list;
  uStack_68 = extraout_RAX_00;
  pHVar7 = (HtmlparserCppTest *)(pHVar12->parser_).parser_;
  HStack_a0.parser_.parser_ = (htmlparser_ctx *)0x106fe5;
  pHVar9 = (HtmlparserCppTest *)puVar21;
  lVar8 = ctemplate_htmlparser::htmlparser_tag((htmlparser_ctx_s *)pHVar7);
  if (lVar8 == 0) {
    HStack_a0.parser_.parser_ = (htmlparser_ctx *)0x10700f;
    ValidateTag();
  }
  else {
    HStack_a0.parser_.parser_ = (htmlparser_ctx *)0x106ff3;
    pHVar9 = (HtmlparserCppTest *)ctemplate_htmlparser::htmlparser_tag((pHVar12->parser_).parser_);
    HStack_a0.parser_.parser_ = (htmlparser_ctx *)0x106ffe;
    pHVar7 = (HtmlparserCppTest *)puVar21;
    iVar6 = std::__cxx11::string::compare(puVar21);
    if (iVar6 == 0) {
      return 0;
    }
  }
  HStack_a0.parser_.parser_ = (htmlparser_ctx *)ValidateAttribute;
  ValidateTag();
  pHVar14 = (HtmlparserCppTest *)(pHVar7->parser_).parser_;
  HStack_a0.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x107027;
  pHVar10 = pHVar9;
  HStack_a0.contextMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)puVar21;
  HStack_a0.parser_.parser_ = (htmlparser_ctx *)pHVar12;
  lVar8 = ctemplate_htmlparser::htmlparser_attr((htmlparser_ctx_s *)pHVar14);
  if (lVar8 == 0) {
    HStack_a0.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x107051;
    ValidateAttribute();
  }
  else {
    HStack_a0.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x107035;
    pHVar10 = (HtmlparserCppTest *)ctemplate_htmlparser::htmlparser_attr((pHVar7->parser_).parser_);
    HStack_a0.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x107040;
    pHVar14 = pHVar9;
    iVar6 = std::__cxx11::string::compare((char *)pHVar9);
    if (iVar6 == 0) {
      return 0;
    }
  }
  HStack_a0.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)ValidateValue;
  ValidateAttribute();
  pHVar12 = (HtmlparserCppTest *)(pHVar14->parser_).parser_;
  auStack_d8._24_8_ = (_Base_ptr)0x10706c;
  pHVar11 = pHVar10;
  HStack_a0.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pHVar9;
  HStack_a0.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pHVar7;
  lVar8 = ctemplate_htmlparser::htmlparser_value((htmlparser_ctx_s *)pHVar12);
  if (lVar8 != 0) {
    auStack_d8._24_8_ = (_Base_ptr)0x10707a;
    pHVar11 = (HtmlparserCppTest *)
              ctemplate_htmlparser::htmlparser_value((pHVar14->parser_).parser_);
    auStack_d8._24_8_ = (_Base_ptr)0x10708f;
    pHVar12 = (HtmlparserCppTest *)&pHStack_b0;
    std::__cxx11::string::string
              ((string *)&pHStack_b0,(char *)pHVar11,(allocator *)(auStack_d8 + 0x27));
    phVar20 = *(htmlparser_ctx **)
               &(pHVar10->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    pHVar14 = (HtmlparserCppTest *)&pHStack_b0;
    if (phVar20 == HStack_a8.parser_) {
      if (phVar20 == (htmlparser_ctx *)0x0) {
LAB_001070b2:
        pHVar12 = &HStack_a0;
        if (pHStack_b0 != pHVar12) {
          auStack_d8._24_8_ = (_Base_ptr)0x1070c4;
          operator_delete(pHStack_b0);
          pHVar12 = extraout_RAX_01;
        }
        return (int)pHVar12;
      }
      pHVar12 = *(HtmlparserCppTest **)&(pHVar10->contextMap)._M_t._M_impl;
      auStack_d8._24_8_ = (_Base_ptr)0x1070ae;
      pHVar11 = pHStack_b0;
      iVar6 = bcmp(pHVar12,pHStack_b0,(size_t)phVar20);
      pHVar14 = pHStack_b0;
      if (iVar6 == 0) goto LAB_001070b2;
    }
    auStack_d8._24_8_ = (_Base_ptr)0x1070d1;
    ValidateValue();
  }
  auStack_d8._24_8_ = ValidateAttributeType;
  ValidateValue();
  auStack_d8._24_8_ = pHVar14;
  auStack_d8._16_8_ = pHVar10;
  pHVar12 = (HtmlparserCppTest *)(pHVar12->parser_).parser_;
  iVar6 = ctemplate_htmlparser::htmlparser_attr_type((htmlparser_ctx_s *)pHVar12);
  puVar21 = kAttributeTypeMap;
  pHVar7 = (HtmlparserCppTest *)IdToName(pHVar12,(IdNameMap *)kAttributeTypeMap,iVar6);
  if (*(long *)&(pHVar11->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header == 0) {
    ValidateAttributeType();
  }
  else {
    pHVar12 = (HtmlparserCppTest *)&pHStack_e8;
    std::__cxx11::string::string((string *)pHVar12,(char *)pHVar7,&aStack_e9);
    sVar3 = *(size_t *)&(pHVar11->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    puVar21 = (undefined1 *)pHVar7;
    if (sVar3 == sStack_e0) {
      uVar18 = (undefined7)((ulong)pHVar11 >> 8);
      if (sVar3 == 0) {
        pHVar11 = (HtmlparserCppTest *)CONCAT71(uVar18,1);
      }
      else {
        pHVar12 = *(HtmlparserCppTest **)&(pHVar11->contextMap)._M_t._M_impl;
        puVar21 = (undefined1 *)pHStack_e8;
        iVar6 = bcmp(pHVar12,pHStack_e8,sVar3);
        pHVar11 = (HtmlparserCppTest *)CONCAT71(uVar18,iVar6 == 0);
      }
    }
    else {
      pHVar11 = (HtmlparserCppTest *)0x0;
    }
    pHVar7 = (HtmlparserCppTest *)auStack_d8;
    if (pHStack_e8 != pHVar7) {
      pHVar12 = pHStack_e8;
      operator_delete(pHStack_e8);
      pHVar7 = extraout_RAX_02;
    }
    pHVar14 = pHStack_e8;
    if ((char)pHVar11 != '\0') {
      return (int)pHVar7;
    }
  }
  ValidateAttributeType();
  uStack_110 = 0x10717a;
  pHStack_100 = pHVar11;
  bVar5 = StringToBool((string *)puVar21);
  uVar19 = CONCAT71(extraout_var,bVar5) & 0xffffffff;
  phVar23 = (pHVar12->parser_).parser_;
  uStack_110 = 0x107185;
  uVar13 = ctemplate_htmlparser::htmlparser_is_attr_quoted(phVar23);
  bVar5 = (int)uVar13 != 0;
  if (SUB81(uVar19,0) == bVar5) {
    return (int)CONCAT71((int7)((ulong)uVar13 >> 8),bVar5);
  }
  uStack_110 = 0x10719b;
  ValidateAttributeQuoted();
  HStack_158.parser_.parser_ = (htmlparser_ctx *)0x1071aa;
  pHStack_118 = pHVar12;
  uStack_110 = uVar19;
  bVar5 = StringToBool((string *)puVar21);
  phVar20 = (htmlparser_ctx *)(CONCAT71(extraout_var_00,bVar5) & 0xffffffff);
  p_Var24 = *(_Base_ptr *)(phVar23 + 0x30);
  HStack_158.parser_.parser_ = (htmlparser_ctx *)0x1071b5;
  uVar13 = ctemplate_htmlparser::htmlparser_in_js((htmlparser_ctx_s *)p_Var24);
  bVar5 = (int)uVar13 != 0;
  if (SUB81(phVar20,0) == bVar5) {
    return (int)CONCAT71((int7)((ulong)uVar13 >> 8),bVar5);
  }
  HStack_158.parser_.parser_ = (htmlparser_ctx *)0x1071cb;
  ValidateInJavascript();
  HStack_158.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071da;
  HStack_158.contextMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)phVar23;
  HStack_158.parser_.parser_ = phVar20;
  bVar5 = StringToBool((string *)puVar21);
  p_Var25 = p_Var24[1]._M_left;
  HStack_158.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071e5;
  uVar13 = ctemplate_htmlparser::htmlparser_is_js_quoted((htmlparser_ctx_s *)p_Var25);
  bVar26 = (int)uVar13 != 0;
  if (bVar5 == bVar26) {
    return (int)CONCAT71((int7)((ulong)uVar13 >> 8),bVar26);
  }
  HStack_158.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071fb;
  ValidateJavascriptQuoted();
  pHVar12 = (HtmlparserCppTest *)p_Var25[1]._M_left;
  HStack_158.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var24;
  HStack_158.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pHVar14;
  iVar6 = ctemplate_htmlparser::htmlparser_js_state((htmlparser_ctx_s *)pHVar12);
  puVar22 = kJavascriptStateMap;
  pHVar7 = (HtmlparserCppTest *)IdToName(pHVar12,(IdNameMap *)kJavascriptStateMap,iVar6);
  if (*(long *)&(((HtmlparserCppTest *)puVar21)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    ValidateJavascriptState();
  }
  else {
    pHVar12 = (HtmlparserCppTest *)&pHStack_168;
    std::__cxx11::string::string((string *)pHVar12,(char *)pHVar7,&aStack_169);
    sVar3 = *(size_t *)
             &(((HtmlparserCppTest *)puVar21)->contextMap)._M_t._M_impl.super__Rb_tree_header.
              _M_header;
    puVar22 = (undefined1 *)pHVar7;
    if (sVar3 == sStack_160) {
      if (sVar3 == 0) {
        bVar5 = true;
      }
      else {
        pHVar12 = *(HtmlparserCppTest **)&(((HtmlparserCppTest *)puVar21)->contextMap)._M_t._M_impl;
        puVar22 = (undefined1 *)pHStack_168;
        iVar6 = bcmp(pHVar12,pHStack_168,sVar3);
        bVar5 = iVar6 == 0;
      }
    }
    else {
      bVar5 = false;
    }
    pHVar7 = &HStack_158;
    if (pHStack_168 != pHVar7) {
      pHVar12 = pHStack_168;
      operator_delete(pHStack_168);
      pHVar7 = extraout_RAX_03;
    }
    pHVar14 = pHStack_168;
    if (bVar5) {
      return (int)pHVar7;
    }
  }
  ValidateJavascriptState();
  bVar5 = StringToBool((string *)puVar22);
  pHVar7 = (HtmlparserCppTest *)(pHVar12->parser_).parser_;
  uVar13 = ctemplate_htmlparser::htmlparser_in_css((htmlparser_ctx_s *)pHVar7);
  bVar26 = (int)uVar13 != 0;
  if (bVar5 == bVar26) {
    return (int)CONCAT71((int7)((ulong)uVar13 >> 8),bVar26);
  }
  ValidateInCss();
  pHVar10 = (HtmlparserCppTest *)&pcStack_1b0;
  pHVar9 = pHVar7;
  HStack_1a8.parser_ = (htmlparser_ctx *)pHVar12;
  if (*(long *)&(((HtmlparserCppTest *)puVar22)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
LAB_00107324:
    pHVar10 = (HtmlparserCppTest *)puVar22;
    p_Stack_1b8 = (_Base_ptr)0x107329;
    ValidateLine();
  }
  else {
    p_Stack_1b8 = (_Base_ptr)0x1072dc;
    pcStack_1b0 = extraout_RAX_04;
    unaff_R15 = (_Base_ptr)__errno_location();
    unaff_R15->_M_color = _S_red;
    pHVar9 = *(HtmlparserCppTest **)&(((HtmlparserCppTest *)puVar22)->contextMap)._M_t._M_impl;
    p_Stack_1b8 = (_Base_ptr)0x1072f8;
    pHVar14 = (HtmlparserCppTest *)strtol((char *)pHVar9,&pcStack_1b0,10);
    pHVar12 = pHVar7;
    puVar22 = (undefined1 *)pHVar10;
    unaff_R12 = (_Base_ptr)&pcStack_1b0;
    if ((*pcStack_1b0 != '\0') ||
       (unaff_R12 = (_Base_ptr)&pcStack_1b0, unaff_R15->_M_color != _S_red)) goto LAB_00107324;
    pHVar9 = (HtmlparserCppTest *)(pHVar7->parser_).parser_;
    p_Stack_1b8 = (_Base_ptr)0x107313;
    iVar6 = ctemplate_htmlparser::htmlparser_get_line_number((htmlparser_ctx_s *)pHVar9);
    unaff_R12 = (_Base_ptr)&pcStack_1b0;
    if (iVar6 == (int)pHVar14) {
      return iVar6;
    }
  }
  p_Stack_1b8 = (_Base_ptr)ValidateColumn;
  ValidateLine();
  pHVar11 = (HtmlparserCppTest *)auStack_1d8;
  pHVar7 = pHVar9;
  auStack_1d8._8_8_ = pHVar12;
  p_Stack_1c8 = unaff_R12;
  pHStack_1c0 = pHVar14;
  p_Stack_1b8 = unaff_R15;
  if (*(long *)&(pHVar10->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header == 0) {
LAB_00107390:
    pHVar11 = pHVar10;
    p_Stack_1e0 = (_Base_ptr)0x107395;
    ValidateColumn();
  }
  else {
    p_Stack_1e0 = (_Base_ptr)0x107348;
    auStack_1d8._0_8_ = extraout_RAX_05;
    unaff_R15 = (_Base_ptr)__errno_location();
    unaff_R15->_M_color = _S_red;
    pHVar7 = *(HtmlparserCppTest **)&(pHVar10->contextMap)._M_t._M_impl;
    p_Stack_1e0 = (_Base_ptr)0x107364;
    pHVar14 = (HtmlparserCppTest *)strtol((char *)pHVar7,(char **)auStack_1d8,10);
    pHVar12 = pHVar9;
    pHVar10 = pHVar11;
    unaff_R12 = (_Base_ptr)auStack_1d8;
    if ((*(char *)auStack_1d8._0_8_ != '\0') ||
       (unaff_R12 = (_Base_ptr)auStack_1d8, unaff_R15->_M_color != _S_red)) goto LAB_00107390;
    pHVar7 = (HtmlparserCppTest *)(pHVar9->parser_).parser_;
    p_Stack_1e0 = (_Base_ptr)0x10737f;
    iVar6 = ctemplate_htmlparser::htmlparser_get_column_number((htmlparser_ctx_s *)pHVar7);
    unaff_R12 = (_Base_ptr)auStack_1d8;
    if (iVar6 == (int)pHVar14) {
      return iVar6;
    }
  }
  p_Stack_1e0 = (_Base_ptr)ValidateValueIndex;
  ValidateColumn();
  pHVar10 = (HtmlparserCppTest *)auStack_200;
  pHVar9 = pHVar7;
  auStack_200._8_8_ = pHVar12;
  p_Stack_1f0 = unaff_R12;
  pHStack_1e8 = pHVar14;
  p_Stack_1e0 = unaff_R15;
  if (*(long *)&(pHVar11->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header != 0) {
    auStack_200._0_8_ = extraout_RAX_06;
    piVar15 = __errno_location();
    *piVar15 = 0;
    pHVar9 = *(HtmlparserCppTest **)&(pHVar11->contextMap)._M_t._M_impl;
    lVar8 = strtol((char *)pHVar9,(char **)auStack_200,10);
    pHVar11 = pHVar10;
    unaff_R12 = (_Base_ptr)auStack_200;
    if ((*(char *)auStack_200._0_8_ == '\0') && (unaff_R12 = (_Base_ptr)auStack_200, *piVar15 == 0))
    {
      pHVar9 = (HtmlparserCppTest *)(pHVar7->parser_).parser_;
      iVar6 = ctemplate_htmlparser::htmlparser_value_index((htmlparser_ctx_s *)pHVar9);
      unaff_R12 = (_Base_ptr)auStack_200;
      if (iVar6 == (int)lVar8) {
        return iVar6;
      }
      goto LAB_00107401;
    }
  }
  pHVar10 = pHVar11;
  ValidateValueIndex();
LAB_00107401:
  ValidateValueIndex();
  bVar5 = StringToBool((string *)pHVar10);
  pHVar12 = (HtmlparserCppTest *)(pHVar9->parser_).parser_;
  uVar13 = ctemplate_htmlparser::htmlparser_is_url_start((htmlparser_ctx_s *)pHVar12);
  bVar26 = (int)uVar13 != 0;
  if (bVar5 == bVar26) {
    return (int)CONCAT71((int7)((ulong)uVar13 >> 8),bVar26);
  }
  ValidateIsUrlStart();
  vStack_260.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_260.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_260.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pHStack_248 = pHVar9;
  p_Stack_240 = unaff_R12;
  SplitStringIntoKeyValuePairs((string *)pHVar10,"=",",",&vStack_260);
  if (vStack_260.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      vStack_260.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    source = &pHVar12->parser_;
    p_Var1 = &(pHVar12->contextMap)._M_t._M_impl.super__Rb_tree_header;
    str_00 = vStack_260.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      StripWhiteSpace(&str_00->first);
      str = &str_00->second;
      StripWhiteSpace(str);
      iVar6 = std::__cxx11::string::compare((char *)str_00);
      if (iVar6 == 0) {
        ValidateState(pHVar12,str);
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)str_00);
        if (iVar6 == 0) {
          ValidateTag(pHVar12,str);
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)str_00);
          if (iVar6 == 0) {
            ValidateAttribute(pHVar12,str);
          }
          else {
            iVar6 = std::__cxx11::string::compare((char *)str_00);
            if (iVar6 == 0) {
              ValidateValue(pHVar12,str);
            }
            else {
              iVar6 = std::__cxx11::string::compare((char *)str_00);
              if (iVar6 == 0) {
                ValidateAttributeType(pHVar12,str);
              }
              else {
                iVar6 = std::__cxx11::string::compare((char *)str_00);
                if (iVar6 == 0) {
                  ValidateAttributeQuoted(pHVar12,str);
                }
                else {
                  iVar6 = std::__cxx11::string::compare((char *)str_00);
                  if (iVar6 == 0) {
                    ValidateInJavascript(pHVar12,str);
                  }
                  else {
                    iVar6 = std::__cxx11::string::compare((char *)str_00);
                    if (iVar6 == 0) {
                      ValidateJavascriptQuoted(pHVar12,str);
                    }
                    else {
                      iVar6 = std::__cxx11::string::compare((char *)str_00);
                      if (iVar6 == 0) {
                        ValidateJavascriptState(pHVar12,str);
                      }
                      else {
                        iVar6 = std::__cxx11::string::compare((char *)str_00);
                        if (iVar6 == 0) {
                          ValidateInCss(pHVar12,str);
                        }
                        else {
                          iVar6 = std::__cxx11::string::compare((char *)str_00);
                          if (iVar6 == 0) {
                            ValidateLine(pHVar12,str);
                          }
                          else {
                            iVar6 = std::__cxx11::string::compare((char *)str_00);
                            if (iVar6 == 0) {
                              ValidateColumn(pHVar12,str);
                            }
                            else {
                              iVar6 = std::__cxx11::string::compare((char *)str_00);
                              if (iVar6 == 0) {
                                ValidateValueIndex(pHVar12,str);
                              }
                              else {
                                iVar6 = std::__cxx11::string::compare((char *)str_00);
                                if (iVar6 == 0) {
                                  ValidateIsUrlStart(pHVar12,str);
                                }
                                else {
                                  iVar6 = std::__cxx11::string::compare((char *)str_00);
                                  if (iVar6 == 0) {
                                    cVar16 = std::
                                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                             ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)pHVar12,str);
                                    if ((_Rb_tree_header *)cVar16._M_node == p_Var1) {
                                      this_00 = (HtmlParser *)operator_new(8);
                                      HtmlParser::HtmlParser(this_00);
                                      ppHVar17 = std::
                                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                 ::operator[](&pHVar12->contextMap,str);
                                      *ppHVar17 = this_00;
                                    }
                                    ppHVar17 = std::
                                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                               ::operator[](&pHVar12->contextMap,str);
                                    HtmlParser::CopyFrom(*ppHVar17,source);
                                  }
                                  else {
                                    iVar6 = std::__cxx11::string::compare((char *)str_00);
                                    if (iVar6 == 0) {
                                      cVar16 = std::
                                               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                               ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)pHVar12,str);
                                      if ((_Rb_tree_header *)cVar16._M_node == p_Var1) {
                                        ProcessAnnotation();
LAB_00107851:
                                        ProcessAnnotation();
                                        std::
                                        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ::~vector(&vStack_260);
                                        _Unwind_Resume(extraout_RAX_07);
                                      }
                                      ppHVar17 = std::
                                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                 ::operator[](&pHVar12->contextMap,str);
                                      HtmlParser::CopyFrom(source,*ppHVar17);
                                    }
                                    else {
                                      iVar6 = std::__cxx11::string::compare((char *)str_00);
                                      if (iVar6 == 0) {
                                        bVar5 = StringToBool(str);
                                        if (bVar5) {
                                          ctemplate_htmlparser::htmlparser_reset(source->parser_);
                                        }
                                      }
                                      else {
                                        this_01 = str_00;
                                        iVar6 = std::__cxx11::string::compare((char *)str_00);
                                        if (iVar6 == 0) {
                                          iVar6 = NameToId((HtmlparserCppTest *)this_01,
                                                           (IdNameMap *)kResetModeMap,str);
                                          ctemplate_htmlparser::htmlparser_reset_mode
                                                    (source->parser_,iVar6);
                                        }
                                        else {
                                          iVar6 = std::__cxx11::string::compare((char *)str_00);
                                          if (iVar6 != 0) goto LAB_00107851;
                                          bVar5 = StringToBool(str);
                                          if (bVar5) {
                                            ctemplate_htmlparser::htmlparser_insert_text
                                                      (source->parser_);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      str_00 = str_00 + 1;
    } while (str_00 != vStack_260.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&vStack_260);
  return extraout_EAX;
}

Assistant:

int HtmlparserCppTest::NameToId(const struct IdNameMap *list,
                                const string &name) {
  CHECK(list != NULL);
  while (list->name) {
    if (name.compare(list->name) == 0) {
      return list->id;
    }
    list++;
  }
  LOG(FATAL) << "Unknown name";
}